

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractDOMParser::endEntityReference(AbstractDOMParser *this,XMLEntityDecl *param_1)

{
  DOMNode *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar3;
  
  if (this->fCreateEntityReferenceNodes == true) {
    iVar2 = (*this->fCurrentParent->_vptr_DOMNode[4])();
    pDVar1 = this->fCurrentParent;
    pDVar3 = (DOMNode *)0x0;
    if (iVar2 == 5) {
      pDVar3 = pDVar1;
    }
    this->fCurrentNode = pDVar1;
    iVar2 = (*pDVar1->_vptr_DOMNode[5])();
    this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var,iVar2);
    if (((DOMNode *)CONCAT44(extraout_var,iVar2) == (DOMNode *)0x0) &&
       (this->fDocument != (DOMDocumentImpl *)0x0)) {
      iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x40])();
      this->fCurrentNode = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
      this->fCurrentParent = (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    }
    if (pDVar3 != (DOMNode *)0x0) {
      (*pDVar3->_vptr_DOMNode[0x2e])(pDVar3,1);
      return;
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::endEntityReference(const XMLEntityDecl&)
{
    if (!fCreateEntityReferenceNodes)
      return;

    DOMEntityReferenceImpl *erImpl = 0;

    if (fCurrentParent->getNodeType() == DOMNode::ENTITY_REFERENCE_NODE)
        erImpl = (DOMEntityReferenceImpl *) fCurrentParent;

    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // When the document is invalid but we continue parsing, we may
    // end up seeing more 'end' events than the 'start' ones.
    //
    if (fCurrentParent == 0 && fDocument != 0)
    {
      fCurrentNode = fDocument->getDocumentElement ();
      fCurrentParent = fCurrentNode;
    }

    if (erImpl)
        erImpl->setReadOnly(true, true);
}